

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

double fdim(double __x,double __y)

{
  bool bVar1;
  ExactFloat *in_RDX;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  
  bVar1 = operator<=(in_RSI,in_RDX);
  if (bVar1) {
    ExactFloat::ExactFloat(in_RDI,0);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    operator-(in_RDI,in_RSI);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

ExactFloat fdim(const ExactFloat& a, const ExactFloat& b) {
  // This formulation has the correct behavior for NaNs.
  return (a <= b) ? 0 : (a - b);
}